

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode UA_Client_disconnect(UA_Client *client)

{
  UA_Connection *pUVar1;
  UA_Boolean UVar2;
  UA_StatusCode UVar3;
  UA_StatusCode UVar4;
  UA_StatusCode UVar5;
  uint uVar6;
  uint uVar7;
  undefined1 auStack_178 [8];
  UA_CloseSessionRequest request;
  undefined1 auStack_f8 [8];
  UA_CloseSessionResponse response;
  undefined4 local_64;
  uint local_60;
  UA_SecureConversationMessageHeader msgHeader;
  UA_SequenceHeader seqHeader;
  UA_UInt32 local_48;
  uint local_44;
  UA_SymmetricAlgorithmSecurityHeader symHeader;
  UA_Byte *local_38;
  
  if (client->state == UA_CLIENTSTATE_READY) {
    uVar7 = 0x808a0000;
  }
  else {
    pUVar1 = &client->connection;
    uVar7 = 0;
    if ((client->connection).state == UA_CONNECTION_ESTABLISHED) {
      UVar2 = UA_NodeId_equal(&client->authenticationToken,&UA_NODEID_NULL);
      uVar7 = 0;
      if (!UVar2) {
        request.requestHeader.additionalHeader.content._16_8_ = 0;
        request.requestHeader.additionalHeader.content.encoded.body.length = 0;
        request.requestHeader.additionalHeader.content.decoded.type = (UA_DataType *)0x0;
        request.requestHeader.additionalHeader.content.decoded.data = (void *)0x0;
        request.requestHeader.timeoutHint = 0;
        request.requestHeader._60_4_ = 0;
        request.requestHeader.additionalHeader.encoding = UA_EXTENSIONOBJECT_ENCODED_NOBODY;
        request.requestHeader.additionalHeader._4_4_ = 0;
        request.requestHeader.auditEntryId.length = 0;
        request.requestHeader.auditEntryId.data = (UA_Byte *)0x0;
        request.requestHeader.timestamp = 0;
        request.requestHeader.requestHandle = 0;
        request.requestHeader.returnDiagnostics = 0;
        request.requestHeader.authenticationToken.identifier.string.length = 0;
        request.requestHeader.authenticationToken.identifier.string.data = (UA_Byte *)0x0;
        auStack_178._0_2_ = 0;
        auStack_178._2_2_ = 0;
        auStack_178._4_4_ = 0;
        request.requestHeader.authenticationToken.namespaceIndex = 0;
        request.requestHeader.authenticationToken._2_2_ = 0;
        request.requestHeader.authenticationToken.identifierType = UA_NODEIDTYPE_NUMERIC;
        request.requestHeader.additionalHeader.content.encoded.body.data = (UA_Byte *)0x0;
        gettimeofday((timeval *)auStack_f8,(__timezone_ptr_t)0x0);
        request.requestHeader.authenticationToken.identifier.string.data =
             (UA_Byte *)
             ((long)auStack_f8 * 10000000 + response.responseHeader.timestamp * 10 +
             0x19db1ded53e8000);
        request.requestHeader.auditEntryId.data =
             (UA_Byte *)CONCAT44(request.requestHeader.auditEntryId.data._4_4_,10000);
        request.requestHeader.additionalHeader.content._32_1_ = 1;
        __UA_Client_Service(client,auStack_178,UA_TYPES + 99,auStack_f8,UA_TYPES + 0x8e);
        deleteMembers_noInit(auStack_178,UA_TYPES + 99);
        request.requestHeader.additionalHeader.content.encoded.body.data = (UA_Byte *)0x0;
        request.requestHeader.additionalHeader.content._16_8_ = 0;
        request.requestHeader.additionalHeader.content.encoded.body.length = 0;
        request.requestHeader.additionalHeader.content.decoded.type = (UA_DataType *)0x0;
        request.requestHeader.additionalHeader.content.decoded.data = (void *)0x0;
        request.requestHeader.timeoutHint = 0;
        request.requestHeader._60_4_ = 0;
        request.requestHeader.additionalHeader.encoding = UA_EXTENSIONOBJECT_ENCODED_NOBODY;
        request.requestHeader.additionalHeader._4_4_ = 0;
        request.requestHeader.auditEntryId.length = 0;
        request.requestHeader.auditEntryId.data = (UA_Byte *)0x0;
        request.requestHeader.timestamp = 0;
        request.requestHeader.requestHandle = 0;
        request.requestHeader.returnDiagnostics = 0;
        request.requestHeader.authenticationToken.identifier.string.length = 0;
        request.requestHeader.authenticationToken.identifier.string.data = (UA_Byte *)0x0;
        auStack_178._0_2_ = 0;
        auStack_178._2_2_ = 0;
        auStack_178._4_4_ = 0;
        request.requestHeader.authenticationToken.namespaceIndex = 0;
        request.requestHeader.authenticationToken._2_2_ = 0;
        request.requestHeader.authenticationToken.identifierType = UA_NODEIDTYPE_NUMERIC;
        deleteMembers_noInit(auStack_f8,UA_TYPES + 0x8e);
        memset(auStack_f8,0,0x88);
        uVar7 = response.responseHeader.timestamp._4_4_;
      }
    }
    if (pUVar1->state == UA_CONNECTION_ESTABLISHED) {
      response.responseHeader.additionalHeader.encoding = UA_EXTENSIONOBJECT_ENCODED_NOBODY;
      response.responseHeader.additionalHeader._4_4_ = 0;
      response.responseHeader.additionalHeader.content.decoded.type = (UA_DataType *)0x0;
      response.responseHeader.stringTableSize = 0;
      response.responseHeader.stringTable = (UA_String *)0x0;
      response.responseHeader.serviceDiagnostics.innerStatusCode = 0;
      response.responseHeader.serviceDiagnostics._44_4_ = 0;
      response.responseHeader.serviceDiagnostics.innerDiagnosticInfo = (UA_DiagnosticInfo *)0x0;
      response.responseHeader.serviceDiagnostics.additionalInfo.length = 0;
      response.responseHeader.serviceDiagnostics.additionalInfo.data = (UA_Byte *)0x0;
      response.responseHeader.serviceDiagnostics.locale = 0;
      response.responseHeader.serviceDiagnostics._20_4_ = 0;
      response.responseHeader.requestHandle = 0;
      response.responseHeader.serviceResult = 0;
      response.responseHeader.serviceDiagnostics._0_4_ = 0;
      response.responseHeader.serviceDiagnostics.symbolicId = 0;
      auStack_f8 = (undefined1  [8])0x0;
      response.responseHeader.timestamp = 0;
      response.responseHeader.serviceDiagnostics.namespaceUri = client->requestHandle + 1;
      client->requestHandle = response.responseHeader.serviceDiagnostics.namespaceUri;
      response.responseHeader.serviceDiagnostics.localizedText = 0;
      gettimeofday((timeval *)auStack_178,(__timezone_ptr_t)0x0);
      response.responseHeader.serviceDiagnostics._0_8_ =
           CONCAT44(auStack_178._4_4_,CONCAT22(auStack_178._2_2_,auStack_178._0_2_)) * 10000000 +
           CONCAT44(request.requestHeader.authenticationToken.identifierType,
                    request.requestHeader.authenticationToken._0_4_) * 10 + 0x19db1ded53e8000;
      response.responseHeader.serviceDiagnostics.additionalInfo.data =
           (UA_Byte *)
           CONCAT44(response.responseHeader.serviceDiagnostics.additionalInfo.data._4_4_,10000);
      UA_copy(&client->authenticationToken,auStack_f8,UA_TYPES + 0x10);
      local_64 = 0x464f4c43;
      msgHeader.messageHeader.messageTypeAndChunkType = (client->channel).securityToken.channelId;
      local_48 = (client->channel).securityToken.tokenId;
      msgHeader.messageHeader.messageSize = (client->channel).sendSequenceNumber + 1;
      (client->channel).sendSequenceNumber = msgHeader.messageHeader.messageSize;
      msgHeader.secureChannelId = client->requestId + 1;
      client->requestId = msgHeader.secureChannelId;
      auStack_178._0_2_ = 0;
      auStack_178._4_4_ = 0;
      request.requestHeader.authenticationToken.namespaceIndex = 0x1c4;
      request.requestHeader.authenticationToken._2_2_ = 0;
      UVar3 = (*(client->connection).getSendBuffer)
                        (pUVar1,(ulong)(client->connection).remoteConf.recvBufferSize,
                         (UA_ByteString *)&symHeader);
      if (UVar3 == 0) {
        pos = local_38 + 0xc;
        end = local_38 + _symHeader;
        exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
        exchangeBufferCallbackHandle = (void *)0x0;
        encodeBuf = (UA_ByteString *)&symHeader;
        UVar4 = UA_encodeBinaryInternal(&local_48,UA_TRANSPORT + 10);
        end = local_38 + _symHeader;
        exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
        exchangeBufferCallbackHandle = (void *)0x0;
        encodeBuf = (UA_ByteString *)&symHeader;
        UVar5 = UA_encodeBinaryInternal(&msgHeader.messageHeader.messageSize,UA_TRANSPORT + 7);
        end = local_38 + _symHeader;
        exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
        exchangeBufferCallbackHandle = (void *)0x0;
        encodeBuf = (UA_ByteString *)&symHeader;
        local_44 = UA_encodeBinaryInternal(auStack_178,UA_TYPES + 0x10);
        end = local_38 + _symHeader;
        exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
        exchangeBufferCallbackHandle = (void *)0x0;
        encodeBuf = (UA_ByteString *)&symHeader;
        UVar3 = UA_encodeBinaryInternal(auStack_f8,UA_TYPES + 0x1f);
        local_60 = (int)pos - (int)local_38;
        uVar6 = UVar3 | local_44;
        pos = local_38;
        end = local_38 + _symHeader;
        encodeBuf = (UA_ByteString *)&symHeader;
        exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
        exchangeBufferCallbackHandle = (void *)0x0;
        UVar3 = UA_encodeBinaryInternal(&local_64,UA_TRANSPORT + 0xb);
        UVar3 = UVar3 | uVar6 | UVar5 | UVar4;
        if (UVar3 == 0) {
          _symHeader = (ulong)local_60;
          UVar3 = (*(client->connection).send)(pUVar1,(UA_ByteString *)&symHeader);
        }
        else {
          (*(client->connection).releaseSendBuffer)(pUVar1,(UA_ByteString *)&symHeader);
        }
        (*(client->connection).close)(pUVar1);
      }
      deleteMembers_noInit(auStack_f8,UA_TYPES + 0x1f);
      uVar7 = uVar7 | UVar3;
    }
  }
  return uVar7;
}

Assistant:

UA_StatusCode UA_Client_disconnect(UA_Client *client) {
    if(client->state == UA_CLIENTSTATE_READY)
        return UA_STATUSCODE_BADNOTCONNECTED;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    /* Is a session established? */
    if(client->connection.state == UA_CONNECTION_ESTABLISHED &&
       !UA_NodeId_equal(&client->authenticationToken, &UA_NODEID_NULL))
        retval = CloseSession(client);
    /* Is a secure channel established? */
    if(client->connection.state == UA_CONNECTION_ESTABLISHED)
        retval |= CloseSecureChannel(client);
    return retval;
}